

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

intptr_t __thiscall Func::GetRuntimeInlineCache(Func *this,uint index)

{
  bool bVar1;
  JITTimeFunctionBody *this_00;
  intptr_t inlineCache;
  uint index_local;
  Func *this_local;
  
  if (((this->m_runtimeInfo == (FunctionJITRuntimeInfo *)0x0) ||
      (bVar1 = FunctionJITRuntimeInfo::HasClonedInlineCaches(this->m_runtimeInfo), !bVar1)) ||
     (this_local = (Func *)FunctionJITRuntimeInfo::GetClonedInlineCache(this->m_runtimeInfo,index),
     this_local == (Func *)0x0)) {
    this_00 = GetJITFunctionBody(this);
    this_local = (Func *)JITTimeFunctionBody::GetInlineCache(this_00,index);
  }
  return (intptr_t)this_local;
}

Assistant:

intptr_t
Func::GetRuntimeInlineCache(const uint index) const
{
    if(m_runtimeInfo != nullptr && m_runtimeInfo->HasClonedInlineCaches())
    {
        intptr_t inlineCache = m_runtimeInfo->GetClonedInlineCache(index);
        if(inlineCache)
        {
            return inlineCache;
        }
    }

    return GetJITFunctionBody()->GetInlineCache(index);
}